

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_matcher.cxx
# Opt level: O0

WithinAbsMatcher *
IntegratorXX::Matchers::WithinAbs
          (WithinAbsMatcher *__return_storage_ptr__,string *msg,double target,double margin)

{
  string local_48;
  double local_28;
  double margin_local;
  double target_local;
  string *msg_local;
  
  local_28 = margin;
  margin_local = target;
  target_local = (double)msg;
  msg_local = (string *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_48,(string *)msg);
  WithinAbsMatcher::WithinAbsMatcher(__return_storage_ptr__,&local_48,margin_local,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

WithinAbsMatcher WithinAbs(std::string msg, double target, double margin) {
    return WithinAbsMatcher(msg, target, margin);
}